

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall ON_SHA1::set_final_hash(ON_SHA1 *this)

{
  byte bVar1;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  byte bVar9;
  long lVar10;
  ON__UINT8 byte_00;
  ON__UINT8 byte_80;
  ON__UINT8 pbFinalCount [8];
  ON__UINT8 local_22 [2];
  undefined4 local_20;
  undefined4 local_1c;
  byte bVar2;
  byte bVar3;
  
  uVar8 = this->m_bit_count[1];
  uVar5 = (ushort)(uVar8 >> 0x10) & 0xff;
  uVar6 = (ushort)(uVar8 >> 8) & 0xff;
  uVar7 = (ushort)uVar8 & 0xff;
  bVar9 = (byte)(uVar8 >> 0x18);
  uVar4 = (ushort)bVar9;
  bVar9 = (uVar4 != 0) * (uVar4 < 0x100) * bVar9 - (0xff < uVar4);
  bVar1 = ((uVar8 & 0xff0000) != 0) * (uVar5 < 0x100) * (char)(uVar8 >> 0x10) - (0xff < uVar5);
  bVar2 = ((uVar8 & 0xff00) != 0) * (uVar6 < 0x100) * (char)(uVar8 >> 8) - (0xff < uVar6);
  bVar3 = ((uVar8 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar8 - (0xff < uVar7);
  local_20 = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                      CONCAT12((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                               CONCAT11((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                                        (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
  uVar8 = this->m_bit_count[0];
  uVar5 = (ushort)(uVar8 >> 0x10) & 0xff;
  uVar6 = (ushort)(uVar8 >> 8) & 0xff;
  uVar7 = (ushort)uVar8 & 0xff;
  bVar9 = (byte)(uVar8 >> 0x18);
  uVar4 = (ushort)bVar9;
  bVar9 = (uVar4 != 0) * (uVar4 < 0x100) * bVar9 - (0xff < uVar4);
  bVar1 = ((uVar8 & 0xff0000) != 0) * (uVar5 < 0x100) * (char)(uVar8 >> 0x10) - (0xff < uVar5);
  bVar2 = ((uVar8 & 0xff00) != 0) * (uVar6 < 0x100) * (char)(uVar8 >> 8) - (0xff < uVar6);
  bVar3 = ((uVar8 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar8 - (0xff < uVar7);
  local_1c = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                      CONCAT12((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                               CONCAT11((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                                        (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9))));
  local_22[1] = 0x80;
  Internal_Accumulate(this,local_22 + 1,1);
  local_22[0] = '\0';
  if ((this->m_bit_count[0] & 0x1f8) != 0x1c0) {
    do {
      Internal_Accumulate(this,local_22,1);
    } while ((this->m_bit_count[0] & 0x1f8) != 0x1c0);
  }
  Internal_Accumulate(this,(ON__UINT8 *)&local_20,8);
  bVar9 = 0;
  lVar10 = 0;
  do {
    (this->m_sha1_hash).m_digest[lVar10] =
         (ON__UINT8)
         (*(uint *)((long)this->m_state + (ulong)((uint)lVar10 & 0xfffffffc)) >> (~bVar9 & 0x18));
    lVar10 = lVar10 + 1;
    bVar9 = bVar9 + 8;
  } while (lVar10 != 0x14);
  return;
}

Assistant:

void ON_SHA1::set_final_hash()
{
  ON__UINT32 i;
  ON__UINT32 bit_count;
  ON__UINT8 pbFinalCount[8];
  bit_count = m_bit_count[1];
  for (i = 0; i < 4; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent
  bit_count = m_bit_count[0];
  for (i = 4; i < 8; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent

  //update((ON__UINT8*)"\200", 1);
  const ON__UINT8 byte_80 = 0x80U;
  Internal_Accumulate(&byte_80, 1);

  const ON__UINT8 byte_00 = 0U;
  while ((m_bit_count[0] & 504) != 448)
    Internal_Accumulate(&byte_00, 1);
    //Internal_Accumulate((ON__UINT8*)"\0", 1);

  Internal_Accumulate(pbFinalCount, 8); // Cause a transform()

  for (i = 0; i < 20; ++i)
    m_sha1_hash.m_digest[i] = static_cast<ON__UINT8>((m_state[i >> 2] >> ((3 - (i & 3)) * 8)) & 0xFF);
}